

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

CoverageOptionSyntax * __thiscall
slang::parsing::Parser::parseCoverageOption(Parser *this,AttrList attributes)

{
  bool bVar1;
  SyntaxNode *this_00;
  BinaryExpressionSyntax *pBVar2;
  ExpressionSyntax *pEVar3;
  SyntaxNode *this_01;
  ScopedNameSyntax *pSVar4;
  NameSyntax *pNVar5;
  CoverageOptionSyntax *pCVar6;
  string_view sVar7;
  SourceRange range;
  Token semi;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  Token token;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  token = ParserBase::peek(&this->super_ParserBase);
  if (token.kind != Identifier) {
    return (CoverageOptionSyntax *)0x0;
  }
  sVar7 = Token::valueText(&token);
  __y._M_str = "option";
  __y._M_len = 6;
  bVar1 = std::operator==(sVar7,__y);
  if (!bVar1) {
    sVar7 = Token::valueText(&token);
    __y_00._M_str = "type_option";
    __y_00._M_len = 0xb;
    bVar1 = std::operator==(sVar7,__y_00);
    if (!bVar1) {
      return (CoverageOptionSyntax *)0x0;
    }
  }
  this_00 = &parseExpression(this)->super_SyntaxNode;
  if (this_00->kind == AssignmentExpression) {
    pBVar2 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>(this_00);
    pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pBVar2->left);
    if ((pEVar3->super_SyntaxNode).kind == ScopedName) {
      this_01 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&pBVar2->left)->super_SyntaxNode;
      pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this_01);
      pNVar5 = not_null<slang::syntax::NameSyntax_*>::get(&pSVar4->left);
      if (((pNVar5->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) &&
         (pNVar5 = not_null<slang::syntax::NameSyntax_*>::get(&pSVar4->right),
         (pNVar5->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName))
      goto LAB_002bc876;
    }
  }
  range = slang::syntax::SyntaxNode::sourceRange(this_00);
  ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x540005,range);
LAB_002bc876:
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004703a8;
  local_60.super_SyntaxListBase.childCount = attributes.size_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       attributes.data_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       attributes.size_;
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pCVar6 = slang::syntax::SyntaxFactory::coverageOption
                     (&this->factory,&local_60,(ExpressionSyntax *)this_00,semi);
  return pCVar6;
}

Assistant:

CoverageOptionSyntax* Parser::parseCoverageOption(AttrList attributes) {
    auto token = peek();
    if (token.kind == TokenKind::Identifier) {
        if (token.valueText() == "option" || token.valueText() == "type_option") {
            auto& expr = parseExpression();
            if (!isValidOption(expr))
                addDiag(diag::InvalidCoverageOption, expr.sourceRange());

            return &factory.coverageOption(attributes, expr, expect(TokenKind::Semicolon));
        }
    }
    return nullptr;
}